

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.h
# Opt level: O2

void __thiscall
FOptionMenuItem::FOptionMenuItem(FOptionMenuItem *this,char *text,FName *action,bool center)

{
  int iVar1;
  
  iVar1 = action->Index;
  (this->super_FListMenuItem).mXpos = 0;
  (this->super_FListMenuItem).mYpos = 0;
  (this->super_FListMenuItem).mAction.Index = iVar1;
  (this->super_FListMenuItem).mEnabled = true;
  (this->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_006e8b70;
  (this->mLabel).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::operator=(&this->mLabel,text);
  this->mCentered = center;
  return;
}

Assistant:

FOptionMenuItem(const char *text, FName action = NAME_None, bool center = false)
		: FListMenuItem(0, 0, action)
	{
		mLabel = text;
		mCentered = center;
	}